

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

bool __thiscall semver::detail::version_parser::is_leading_zero(version_parser *this,int digit)

{
  int iVar1;
  pointer ptVar2;
  int iVar3;
  
  iVar1 = 0;
  if (digit != 0) {
    return false;
  }
  ptVar2 = (this->stream->tokens).
           super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl
           .super__Vector_impl_data._M_start + this->stream->current;
  iVar3 = 0;
  while( true ) {
    if (2 < (byte)(ptVar2->type - hyphen)) break;
    iVar3 = iVar3 + (uint)(ptVar2->type == digit);
    iVar1 = iVar1 + 1;
    ptVar2 = ptVar2 + 1;
  }
  return iVar1 == iVar3 && iVar3 != 0;
}

Assistant:

SEMVER_CONSTEXPR bool is_leading_zero(int digit) noexcept {
    if (digit != 0) {
      return false;
    }

    int k = 0;
    int alpha_numerics = 0;
    int digits = 0;

    while (true) {
      const token token = stream.peek(k);

      if (!is_alphanumeric(token)) {
        break;
      }

      ++alpha_numerics;

      if (is_digit(token)) {
        ++digits;
      }

      ++k;
    }

    return digits > 0 && digits == alpha_numerics;
  }